

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viff.cxx
# Opt level: O3

void vigra::map_multiband<unsigned_char,unsigned_short>
               (void_vector<unsigned_short> *dest,uint *dest_bands,void_vector<unsigned_char> *src,
               uint src_bands,uint src_width,uint src_height,void_vector<unsigned_short> *maps,
               uint map_bands,uint map_width,uint map_height)

{
  value_type_conflict3 vVar1;
  uint uVar2;
  uint uVar3;
  PreconditionViolation *this;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint band;
  ulong uVar7;
  ulong uVar8;
  colormap<unsigned_char,_unsigned_short> local_58;
  
  if (src_bands != 1) {
    this = (PreconditionViolation *)__cxa_allocate_exception(0x28);
    PreconditionViolation::PreconditionViolation
              (this,"map_multiband(): Source image must have one band.",
               "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/viff.cxx"
               ,0x108);
    __cxa_throw(this,&PreconditionViolation::typeinfo,ContractViolation::~ContractViolation);
  }
  colormap<unsigned_char,_unsigned_short>::colormap(&local_58,map_height,map_bands,map_width);
  if (map_bands != 0) {
    uVar8 = 0;
    uVar7 = 0;
    do {
      colormap<unsigned_char,_unsigned_short>::initialize
                (&local_58,
                 (value_type_conflict3 *)(uVar8 * 2 + (long)(maps->super_void_vector_base).m_data),
                 (uint)uVar7);
      uVar7 = uVar7 + 1;
      uVar8 = (ulong)((int)uVar8 + map_height * map_width);
    } while (map_bands != uVar7);
  }
  uVar2 = src_height * src_width;
  *dest_bands = map_bands * map_width;
  void_vector_base::reserve
            (&dest->super_void_vector_base,(ulong)(map_bands * map_width * uVar2) * 2);
  (dest->super_void_vector_base).m_size = (dest->super_void_vector_base).m_capacity;
  uVar3 = *dest_bands;
  if (map_width < 2) {
    if (uVar3 != 0) {
      uVar6 = 0;
      band = 0;
      do {
        uVar7 = (ulong)uVar2;
        uVar4 = uVar6;
        if (uVar2 != 0) {
          do {
            vVar1 = colormap<unsigned_char,_unsigned_short>::operator()
                              (&local_58,
                               *(domain_type *)
                                ((long)(src->super_void_vector_base).m_data + (ulong)uVar4),band);
            *(value_type_conflict3 *)
             ((long)(dest->super_void_vector_base).m_data + (ulong)uVar4 * 2) = vVar1;
            uVar4 = uVar4 + 1;
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
          uVar3 = *dest_bands;
        }
        band = band + 1;
        uVar6 = uVar6 + uVar2;
      } while (band < uVar3);
    }
  }
  else if (uVar3 != 0) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      if (uVar2 != 0) {
        uVar7 = 0;
        do {
          vVar1 = colormap<unsigned_char,_unsigned_short>::operator()
                            (&local_58,
                             *(domain_type *)((long)(src->super_void_vector_base).m_data + uVar7),
                             uVar6);
          *(value_type_conflict3 *)
           ((long)(dest->super_void_vector_base).m_data + (ulong)(uint)((int)lVar5 + (int)uVar7) * 2
           ) = vVar1;
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
        uVar3 = *dest_bands;
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + (ulong)uVar2;
    } while (uVar6 < uVar3);
  }
  if (local_58.m_tables.super_void_vector_base.m_data != (void *)0x0) {
    operator_delete(local_58.m_tables.super_void_vector_base.m_data);
  }
  return;
}

Assistant:

void map_multiband( void_vector<map_storage_type> & dest,
                        unsigned int & dest_bands,
                        const void_vector<storage_type> & src,
                        unsigned int src_bands, unsigned int src_width, unsigned int src_height,
                        const void_vector<map_storage_type> & maps,
                        unsigned int map_bands, unsigned int map_width, unsigned int map_height )
    {
        vigra_precondition(src_bands == 1u,
               "map_multiband(): Source image must have one band.");

        typedef colormap< storage_type, map_storage_type > colormap_type;
        const unsigned int num_pixels = src_width * src_height;

        // build the color map
        const unsigned int map_band_size = map_width * map_height;
        colormap_type colormap( map_height, map_bands, map_width );
        for ( unsigned int i = 0; i < map_bands; ++i )
            colormap.initialize( maps.data() + map_band_size * i, i );

        // map each pixel
        const unsigned int band_size = src_width * src_height;
        dest_bands = map_bands * map_width;
        dest.resize( band_size * dest_bands );
        if ( map_width > 1 ) {
            // interleaved maps => there is only one band in the image
            for( unsigned int bandnum = 0; bandnum < dest_bands; ++bandnum )
                for( unsigned int i = 0; i < num_pixels; ++i )
                    dest[ bandnum * band_size + i ]
                        = colormap( src[i], bandnum );
        } else {
            // non-interleaved bands => map can be used per band
            for( unsigned int bandnum = 0; bandnum < dest_bands; ++bandnum )
                for( unsigned int i = 0; i < num_pixels; ++i )
                    dest[ bandnum * band_size + i ]
                        = colormap( src[ bandnum * band_size + i ], bandnum );
        }
    }